

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::QuadraticCost::setStateCost
          (QuadraticCost *this,MatrixDynSize *stateHessian,VectorDynSize *stateGradient)

{
  long lVar1;
  long lVar2;
  TimeInvariantObject<iDynTree::MatrixDynSize> *__p;
  TimeInvariantObject<iDynTree::MatrixDynSize> *this_00;
  long in_RDI;
  bool local_1;
  
  lVar1 = iDynTree::MatrixDynSize::rows();
  lVar2 = iDynTree::MatrixDynSize::cols();
  if (lVar1 == lVar2) {
    lVar1 = iDynTree::MatrixDynSize::rows();
    lVar2 = iDynTree::VectorDynSize::size();
    if (lVar1 == lVar2) {
      __p = (TimeInvariantObject<iDynTree::MatrixDynSize> *)(in_RDI + 0x28);
      this_00 = (TimeInvariantObject<iDynTree::MatrixDynSize> *)operator_new(0x30);
      TimeInvariantObject<iDynTree::MatrixDynSize>::TimeInvariantObject
                (this_00,(MatrixDynSize *)__p);
      std::
      __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,(__gnu_cxx::_Lock_policy)2>
      ::reset<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>
                ((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
                  *)this_00,__p);
      operator_new(0x28);
      TimeInvariantObject<iDynTree::VectorDynSize>::TimeInvariantObject
                ((TimeInvariantObject<iDynTree::VectorDynSize> *)this_00,(VectorDynSize *)__p);
      std::
      __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,(__gnu_cxx::_Lock_policy)2>
      ::reset<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>>
                ((__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                  *)this_00,(TimeInvariantObject<iDynTree::VectorDynSize> *)__p);
      local_1 = true;
    }
    else {
      iDynTree::reportError
                ("QuadraticCost","setStateCost",
                 "stateHessian and stateGradient have inconsistent dimensions.");
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("QuadraticCost","setStateCost","The stateHessian matrix is supposed to be square.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QuadraticCost::setStateCost(const MatrixDynSize &stateHessian, const VectorDynSize &stateGradient)
        {
            if (stateHessian.rows() != stateHessian.cols()) {
                reportError("QuadraticCost", "setStateCost", "The stateHessian matrix is supposed to be square.");
                return false;
            }

            if (stateHessian.rows() != stateGradient.size()) {
                reportError("QuadraticCost", "setStateCost", "stateHessian and stateGradient have inconsistent dimensions.");
                return false;
            }

            m_timeVaryingStateHessian.reset(new TimeInvariantMatrix(stateHessian));
            m_timeVaryingStateGradient.reset(new TimeInvariantVector(stateGradient));

            return true;
        }